

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O0

int Gia_ManAreCubeCollectList(Gia_ManAre_t *p,Gia_PtrAre_t *pRoot,Gia_StaAre_t *pSta)

{
  int iVar1;
  uint local_2c;
  Gia_StaAre_t *pGStack_28;
  int iCube;
  Gia_StaAre_t *pCube;
  Gia_StaAre_t *pSta_local;
  Gia_PtrAre_t *pRoot_local;
  Gia_ManAre_t *p_local;
  
  local_2c = Gia_Ptr2Int(*pRoot);
  pGStack_28 = Gia_ManAreSta(p,*pRoot);
  while (iVar1 = Gia_StaIsGood(p,pGStack_28), iVar1 != 0) {
    iVar1 = Gia_StaIsUnused(pGStack_28);
    if ((iVar1 == 0) && (iVar1 = Gia_StaAreDisjoint(pSta,pGStack_28,p->nWords), iVar1 == 0)) {
      if (p->iStaCur < (int)local_2c) {
        Vec_IntPush(p->vCubesB,local_2c);
      }
      else {
        Vec_IntPush(p->vCubesA,local_2c);
      }
    }
    local_2c = Gia_Ptr2Int(pGStack_28->iNext);
    pGStack_28 = Gia_StaNext(p,pGStack_28);
  }
  return 1;
}

Assistant:

static inline int Gia_ManAreCubeCollectList( Gia_ManAre_t * p, Gia_PtrAre_t * pRoot, Gia_StaAre_t * pSta )
{
    Gia_StaAre_t * pCube;
    int iCube;
    Gia_ManAreForEachCubeList2( p, *pRoot, pCube, iCube )
    {
        if ( Gia_StaIsUnused( pCube ) )
            continue;
        if ( Gia_StaAreDisjoint( pSta, pCube, p->nWords ) )
        {
/*
            int iVar;
            p->nDisjs++;
            iVar = Gia_StaAreDisjointVar( pSta, pCube, p->nWords );
            if ( iVar >= 0 )
            {
                p->nDisjs2++;
                if ( iCube > p->iStaCur )
                    p->nDisjs3++;
            }
*/
            continue;
        }
//        p->nCompares++;
//        p->nEquals += Gia_StaAreEqual( pSta, pCube, p->nWords );
        if ( iCube <= p->iStaCur )
            Vec_IntPush( p->vCubesA, iCube );
        else
            Vec_IntPush( p->vCubesB, iCube );
    }
    return 1;
}